

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSRefCountHeader *p;
  JSValueUnion JVar2;
  JSValue JVar3;
  
  iVar1 = this_val.tag;
  JVar2 = this_val.u;
  if ((int)this_val.tag == -1) {
    if ((*(short *)((long)JVar2.ptr + 6) != 5) ||
       (iVar1 = *(int64_t *)((long)JVar2.ptr + 0x38), (int)iVar1 != -7)) goto LAB_00159753;
    JVar2 = (JSValueUnion)((JSValueUnion *)((long)JVar2.ptr + 0x30))->ptr;
  }
  else if ((int)this_val.tag != -7) {
LAB_00159753:
    JVar2.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not a string");
    iVar1 = 6;
    goto LAB_00159766;
  }
  *(int *)JVar2.ptr = *JVar2.ptr + 1;
LAB_00159766:
  JVar3.tag = iVar1;
  JVar3.u.ptr = JVar2.ptr;
  return JVar3;
}

Assistant:

static JSValue js_string_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    return js_thisStringValue(ctx, this_val);
}